

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::grow
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,size_t MinSize)

{
  move_iterator<llbuild::buildsystem::BuildKey_*> __first;
  BuildKey *S;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *__ptr;
  uint64_t uVar1;
  BuildKey *__result;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = NextPowerOf2((ulong)(this->
                              super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>)
                              .super_SmallVectorBase.Capacity + 2);
  if (MinSize < uVar1) {
    MinSize = uVar1;
  }
  if (0xfffffffe < MinSize) {
    MinSize = 0xffffffff;
  }
  __result = (BuildKey *)safe_malloc(MinSize << 5);
  __first._M_current =
       (BuildKey *)
       (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
       super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llbuild::buildsystem::BuildKey*>,llbuild::buildsystem::BuildKey*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                     super_SmallVectorBase.Size,__result);
  S = (BuildKey *)
      (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
      super_SmallVectorBase.BeginX;
  destroy_range(S,S + (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                      super_SmallVectorBase.Size);
  __ptr = (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
          (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
  super_SmallVectorBase.BeginX = __result;
  (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
  super_SmallVectorBase.Capacity = (uint)MinSize;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}